

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

string * __thiscall
gnuplotio::GnuplotTmpfileCollection::make_tmpfile_abi_cxx11_
          (string *__return_storage_ptr__,GnuplotTmpfileCollection *this)

{
  GnuplotTmpfile *this_00;
  element_type *this_01;
  string *psVar1;
  undefined1 local_30 [8];
  shared_ptr<gnuplotio::GnuplotTmpfile> tmp_file;
  bool debug_messages;
  GnuplotTmpfileCollection *this_local;
  
  tmp_file.super___shared_ptr<gnuplotio::GnuplotTmpfile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 0;
  this_00 = (GnuplotTmpfile *)operator_new(0x28);
  GnuplotTmpfile::GnuplotTmpfile(this_00,false);
  std::shared_ptr<gnuplotio::GnuplotTmpfile>::shared_ptr<gnuplotio::GnuplotTmpfile,void>
            ((shared_ptr<gnuplotio::GnuplotTmpfile> *)local_30,this_00);
  std::
  vector<std::shared_ptr<gnuplotio::GnuplotTmpfile>,_std::allocator<std::shared_ptr<gnuplotio::GnuplotTmpfile>_>_>
  ::push_back(&this->tmp_files,(shared_ptr<gnuplotio::GnuplotTmpfile> *)local_30);
  this_01 = std::
            __shared_ptr_access<gnuplotio::GnuplotTmpfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<gnuplotio::GnuplotTmpfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_30);
  psVar1 = boost::filesystem::path::string_abi_cxx11_(&this_01->file);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  std::shared_ptr<gnuplotio::GnuplotTmpfile>::~shared_ptr
            ((shared_ptr<gnuplotio::GnuplotTmpfile> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string make_tmpfile() {
        const bool debug_messages = false;
        std::shared_ptr<GnuplotTmpfile> tmp_file(new GnuplotTmpfile(debug_messages));
        // The file will be removed once the pointer is removed from the
        // tmp_files container.
        tmp_files.push_back(tmp_file);
        return tmp_file->file.string();
    }